

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPAT.cpp
# Opt level: O1

void __thiscall OpenMD::NPAT::evolveEtaA(NPAT *this)

{
  uint i;
  ulong uVar1;
  long lVar2;
  uint j;
  long lVar3;
  Mat3x3d *pMVar4;
  
  uVar1 = (ulong)this->axis_;
  *(double *)
   ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
   uVar1 * 0x20) =
       (((this->super_NPT).targetPressure / -163882576.0 +
        *(double *)
         ((long)(this->super_NPT).press.super_SquareMatrix<double,_3>.
                super_RectMatrix<double,_3U,_3U>.data_ + uVar1 * 0x20)) *
       (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2 *
       (this->super_NPT).instaVol) / ((this->super_NPT).NkBT * (this->super_NPT).tb2) +
       *(double *)
        ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
        uVar1 * 0x20);
  pMVar4 = &this->oldEta_;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      (pMVar4->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar3] =
           pMVar4[-1].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar3]
      ;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar2 = lVar2 + 1;
    pMVar4 = (Mat3x3d *)
             ((pMVar4->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  } while (lVar2 != 3);
  return;
}

Assistant:

void NPAT::evolveEtaA() {
    eta(axis_, axis_) +=
        dt2 * instaVol *
        (press(axis_, axis_) - targetPressure / Constants::pressureConvert) /
        (NkBT * tb2);
    oldEta_ = eta;
  }